

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestGroupStats::~TestGroupStats(TestGroupStats *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_00181020;
  pcVar2 = (this->groupInfo).name._M_dataplus._M_p;
  paVar1 = &(this->groupInfo).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x78);
  return;
}

Assistant:

TestGroupStats::~TestGroupStats() = default;